

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

uint32_t sub_word(uint32_t w,uint8_t *sbox)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint in_R9D;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  
  lVar5 = 0;
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  uVar6 = 0;
  while( true ) {
    if (lVar5 == 0x100) break;
    uVar7 = (uint)lVar5;
    uVar8 = uVar7 ^ w >> 8;
    uVar9 = uVar7 ^ w >> 0x10;
    uVar10 = uVar7 ^ w >> 0x18;
    auVar11._0_4_ = (-(uVar7 ^ w) | uVar7 ^ w) << 0x18;
    auVar11._4_4_ = (-uVar8 | uVar8) << 0x18;
    auVar11._8_4_ = (-uVar9 | uVar9) << 0x18;
    auVar11._12_4_ = (-uVar10 | uVar10) << 0x18;
    uVar7 = movmskps(in_R9D,auVar11);
    in_R9D = uVar7 ^ 0xf;
    bVar1 = sbox[lVar5];
    if ((in_R9D & 8) != 0) {
      uVar6 = (uint)bVar1;
    }
    if ((in_R9D & 4) != 0) {
      uVar4 = (uint)bVar1;
    }
    if ((in_R9D & 2) != 0) {
      uVar2 = (uint)bVar1;
    }
    if ((in_R9D & 1) != 0) {
      uVar3 = (uint)bVar1;
    }
    lVar5 = lVar5 + 1;
  }
  return uVar2 << 8 | uVar4 << 0x10 | uVar6 << 0x18 | uVar3;
}

Assistant:

static uint32_t sub_word(uint32_t w, const uint8_t *sbox)
{
  uint8_t a = byte(w, 0),
          b = byte(w, 1),
          c = byte(w, 2),
          d = byte(w, 3);
#if CF_CACHE_SIDE_CHANNEL_PROTECTION
  select_u8x4(&a, &b, &c, &d, sbox, 256);
#else
  a = sbox[a];
  b = sbox[b];
  c = sbox[c];
  d = sbox[d];
#endif
  return word4(a, b, c, d);
}